

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

CSVError *
duckdb::CSVError::HeaderSniffingError
          (CSVError *__return_storage_ptr__,CSVReaderOptions *options,
          vector<duckdb::HeaderValue,_true> *best_header_row,idx_t column_count,string *delimiter)

{
  ostream *poVar1;
  const_reference pvVar2;
  ostream *poVar3;
  ostringstream *poVar4;
  char *pcVar5;
  idx_t i;
  ulong __n;
  LinesPerBoundary local_1d8;
  string local_1c8;
  ostringstream error;
  
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
  poVar1 = ::std::operator<<((ostream *)&error,"Error when sniffing file \"");
  poVar1 = ::std::operator<<(poVar1,(string *)&options->file_path);
  poVar1 = ::std::operator<<(poVar1,"\".");
  ::std::operator<<(poVar1,'\n');
  poVar1 = ::std::operator<<((ostream *)&error,
                             "It was not possible to detect the CSV Header, due to the header having less columns than expected"
                            );
  ::std::operator<<(poVar1,'\n');
  poVar1 = ::std::operator<<((ostream *)&error,"Number of expected columns: ");
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = ::std::operator<<(poVar1,". Actual number of columns ");
  poVar1 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  ::std::operator<<(poVar1,'\n');
  poVar1 = ::std::operator<<((ostream *)&error,"Detected row as Header:");
  ::std::operator<<(poVar1,'\n');
  for (__n = 0; __n < (ulong)(((long)(best_header_row->
                                     super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>
                                     ).
                                     super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(best_header_row->
                                    super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>
                                    ).
                                    super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x28);
      __n = __n + 1) {
    pvVar2 = vector<duckdb::HeaderValue,_true>::get<true>(best_header_row,__n);
    if (pvVar2->is_null == true) {
      ::std::operator<<((ostream *)&error,"NULL");
    }
    else {
      pvVar2 = vector<duckdb::HeaderValue,_true>::get<true>(best_header_row,__n);
      ::std::operator<<((ostream *)&error,(string *)&pvVar2->value);
    }
    if (__n < ((long)(best_header_row->
                     super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>).
                     super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(best_header_row->
                    super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>).
                    super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x28 - 1U) {
      poVar1 = ::std::operator<<((ostream *)&error,(string *)delimiter);
      ::std::operator<<(poVar1," ");
    }
  }
  ::std::operator<<((ostream *)&error,anon_var_dwarf_4b4b0eb + 8);
  poVar1 = (ostream *)&error;
  poVar3 = ::std::operator<<(poVar1,"Possible fixes:");
  ::std::operator<<(poVar3,'\n');
  if ((options->dialect_options).state_machine_options.strict_mode.value == true) {
    poVar3 = ::std::operator<<((ostream *)&error,
                               "* Disable the parser\'s strict mode (strict_mode=false) to allow reading rows that do not comply with the CSV standard."
                              );
    ::std::operator<<(poVar3,'\n');
  }
  if ((options->dialect_options).header.set_by_user == true) {
    poVar1 = ::std::operator<<((ostream *)&error,"* Header is set to \'");
    poVar1 = ::std::ostream::_M_insert<bool>(SUB81(poVar1,0));
    pcVar5 = "\'. Consider unsetting it.";
  }
  else {
    pcVar5 = 
    "* Set header (header = true) if your CSV has a header, or (header = false) if it doesn\'t";
  }
  poVar1 = ::std::operator<<(poVar1,pcVar5);
  ::std::operator<<(poVar1,'\n');
  if ((options->dialect_options).skip_rows.set_by_user == true) {
    poVar1 = ::std::operator<<((ostream *)&error,"* Skip is set to \'");
    poVar4 = (ostringstream *)::std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    pcVar5 = "\'. Consider unsetting it.";
  }
  else {
    pcVar5 = "* Set skip (skip=${n}) to skip ${n} lines at the top of the file";
    poVar4 = &error;
  }
  poVar1 = ::std::operator<<((ostream *)poVar4,pcVar5);
  ::std::operator<<(poVar1,'\n');
  if ((options->ignore_errors).value == false) {
    poVar1 = ::std::operator<<((ostream *)&error,
                               "* Enable ignore errors (ignore_errors=true) to ignore potential errors"
                              );
    ::std::operator<<(poVar1,'\n');
  }
  if (options->null_padding == false) {
    poVar1 = ::std::operator<<((ostream *)&error,
                               "* Enable null padding (null_padding=true) to pad missing columns with NULL values"
                              );
    ::std::operator<<(poVar1,'\n');
  }
  ::std::__cxx11::stringbuf::str();
  LinesPerBoundary::LinesPerBoundary(&local_1d8);
  CSVError(__return_storage_ptr__,&local_1c8,SNIFFING,local_1d8);
  ::std::__cxx11::string::~string((string *)&local_1c8);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
  return __return_storage_ptr__;
}

Assistant:

CSVError CSVError::HeaderSniffingError(const CSVReaderOptions &options, const vector<HeaderValue> &best_header_row,
                                       const idx_t column_count, const string &delimiter) {
	std::ostringstream error;
	// 1. Which file
	error << "Error when sniffing file \"" << options.file_path << "\"." << '\n';
	// 2. What's the error
	error << "It was not possible to detect the CSV Header, due to the header having less columns than expected"
	      << '\n';
	// 2.1 What's the expected number of columns
	error << "Number of expected columns: " << column_count << ". Actual number of columns " << best_header_row.size()
	      << '\n';
	// 2.2 What was the detected row
	error << "Detected row as Header:" << '\n';
	for (idx_t i = 0; i < best_header_row.size(); i++) {
		if (best_header_row[i].is_null) {
			error << "NULL";
		} else {
			error << best_header_row[i].value;
		}
		if (i < best_header_row.size() - 1) {
			error << delimiter << " ";
		}
	}
	error << "\n";

	// 3. Suggest how to fix it!
	error << "Possible fixes:" << '\n';
	if (options.dialect_options.state_machine_options.strict_mode.GetValue()) {
		error << "* Disable the parser's strict mode (strict_mode=false) to allow reading rows that do not comply with "
		         "the CSV standard."
		      << '\n';
	}
	// header
	if (!options.dialect_options.header.IsSetByUser()) {
		error << "* Set header (header = true) if your CSV has a header, or (header = false) if it doesn't" << '\n';
	} else {
		error << "* Header is set to \'" << options.dialect_options.header.GetValue() << "\'. Consider unsetting it."
		      << '\n';
	}
	// skip_rows
	if (!options.dialect_options.skip_rows.IsSetByUser()) {
		error << "* Set skip (skip=${n}) to skip ${n} lines at the top of the file" << '\n';
	} else {
		error << "* Skip is set to \'" << options.dialect_options.skip_rows.GetValue() << "\'. Consider unsetting it."
		      << '\n';
	}
	// ignore_errors
	if (!options.ignore_errors.GetValue()) {
		error << "* Enable ignore errors (ignore_errors=true) to ignore potential errors" << '\n';
	}
	// null_padding
	if (!options.null_padding) {
		error << "* Enable null padding (null_padding=true) to pad missing columns with NULL values" << '\n';
	}

	return CSVError(error.str(), SNIFFING, {});
}